

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::V1MessageLite::ByteSizeLong(V1MessageLite *this)

{
  uint uVar1;
  bool bVar2;
  int32_t value;
  V1EnumLite value_00;
  int desired;
  uint32_t *puVar3;
  size_t sVar4;
  long lVar5;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  V1MessageLite *this_;
  V1MessageLite *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = 0;
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar3;
  if ((uVar1 & 1) != 0) {
    value = _internal_int_field(this);
    sStack_58 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(value);
  }
  if ((uVar1 & 2) != 0) {
    value_00 = _internal_enum_field(this);
    sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(value_00);
    sStack_58 = sVar4 + 1 + sStack_58;
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar2) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar5 = std::__cxx11::string::size();
    sStack_58 = lVar5 + sStack_58;
  }
  desired = google::protobuf::internal::ToCachedSize(sStack_58);
  google::protobuf::internal::CachedSize::Set(&(this->field_0)._impl_._cached_size_,desired);
  return sStack_58;
}

Assistant:

::size_t V1MessageLite::ByteSizeLong() const {
  const V1MessageLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.V1MessageLite)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // int32 int_field = 1 [features = {
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_int_field());
    }
  }
   {
    // .proto2_unittest.V1EnumLite enum_field = 2 [default = V1_FIRST];
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_enum_field());
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}